

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

hugeint_t duckdb::DecimalScaleDownOperator::Operation<int,duckdb::hugeint_t>
                    (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  int iVar1;
  DecimalScaleInput<int,_int> *data;
  hugeint_t hVar2;
  
  iVar1 = input / (*(int *)((long)dataptr + 0x24) / 2);
  hVar2 = Cast::Operation<int,duckdb::hugeint_t>((int)(iVar1 + (iVar1 >> 0x1f | 1U)) / 2);
  return hVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}